

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildInit(ImFontAtlas *atlas)

{
  int iVar1;
  ImFontAtlas *atlas_local;
  
  if (atlas->PackIdMouseCursors < 0) {
    if ((atlas->Flags & 2U) == 0) {
      iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,0xd9,0x1b);
      atlas->PackIdMouseCursors = iVar1;
    }
    else {
      iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,2,2);
      atlas->PackIdMouseCursors = iVar1;
    }
  }
  if ((atlas->PackIdLines < 0) && ((atlas->Flags & 4U) == 0)) {
    iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,0x41,0x40);
    atlas->PackIdLines = iVar1;
  }
  return;
}

Assistant:

void ImFontAtlasBuildInit(ImFontAtlas* atlas)
{
    // Register texture region for mouse cursors or standard white pixels
    if (atlas->PackIdMouseCursors < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
        else
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(2, 2);
    }

    // Register texture region for thick lines
    // The +2 here is to give space for the end caps, whilst height +1 is to accommodate the fact we have a zero-width row
    if (atlas->PackIdLines < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoBakedLines))
            atlas->PackIdLines = atlas->AddCustomRectRegular(IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 2, IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 1);
    }
}